

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O3

void lj_gc_fullgc(lua_State *L)

{
  undefined4 uVar1;
  uint64_t uVar2;
  
  uVar2 = (L->glref).ptr64;
  uVar1 = *(undefined4 *)(uVar2 + 0xb8);
  *(undefined4 *)(uVar2 + 0xb8) = 0xfffffffd;
  if (*(byte *)(uVar2 + 0x21) < 3) {
    *(uint64_t *)(uVar2 + 0x30) = uVar2 + 0x28;
    *(undefined8 *)(uVar2 + 0x38) = 0;
    *(undefined8 *)(uVar2 + 0x40) = 0;
    *(undefined8 *)(uVar2 + 0x48) = 0;
    *(undefined1 *)(uVar2 + 0x21) = 3;
    *(undefined4 *)(uVar2 + 0x24) = 0;
  }
  else if (1 < (byte)(*(byte *)(uVar2 + 0x21) - 3)) goto LAB_00127081;
  do {
    gc_onestep(L);
  } while ((byte)(*(char *)(uVar2 + 0x21) - 3U) < 2);
LAB_00127081:
  *(undefined1 *)(uVar2 + 0x21) = 0;
  do {
    gc_onestep(L);
  } while (*(char *)(uVar2 + 0x21) != '\0');
  *(ulong *)(uVar2 + 0x18) = (ulong)*(uint *)(uVar2 + 0x6c) * (*(ulong *)(uVar2 + 0x60) / 100);
  *(undefined4 *)(uVar2 + 0xb8) = uVar1;
  return;
}

Assistant:

void lj_gc_fullgc(lua_State *L)
{
  global_State *g = G(L);
  int32_t ostate = g->vmstate;
  setvmstate(g, GC);
  if (g->gc.state <= GCSatomic) {  /* Caught somewhere in the middle. */
    setmref(g->gc.sweep, &g->gc.root);  /* Sweep everything (preserving it). */
    setgcrefnull(g->gc.gray);  /* Reset lists from partial propagation. */
    setgcrefnull(g->gc.grayagain);
    setgcrefnull(g->gc.weak);
    g->gc.state = GCSsweepstring;  /* Fast forward to the sweep phase. */
    g->gc.sweepstr = 0;
  }
  while (g->gc.state == GCSsweepstring || g->gc.state == GCSsweep)
    gc_onestep(L);  /* Finish sweep. */
  lj_assertG(g->gc.state == GCSfinalize || g->gc.state == GCSpause,
	     "bad GC state");
  /* Now perform a full GC. */
  g->gc.state = GCSpause;
  do { gc_onestep(L); } while (g->gc.state != GCSpause);
  g->gc.threshold = (g->gc.estimate/100) * g->gc.pause;
  g->vmstate = ostate;
}